

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O1

int CmpClass(void *p,void *va,void *vb)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  nodeclass **b;
  nodeclass **a;
  
  uVar1 = *(uint *)(*vb + 0x50);
  uVar5 = 1;
  uVar2 = *(uint *)(*va + 0x50);
  if ((uVar1 > uVar2 || uVar2 == uVar1) && (uVar5 = 0xffffffff, uVar1 <= uVar2)) {
    uVar3 = *(ulong *)(*va + 0x10);
    uVar4 = *(ulong *)(*vb + 0x10);
    uVar5 = 0;
    if (uVar3 != uVar4) {
      uVar5 = (uVar4 < uVar3) - 1 | 1;
    }
  }
  return uVar5;
}

Assistant:

static NOINLINE int CmpClass(const void* UNUSED_PARAM(p), const void* va, const void* vb)
{
    const nodeclass* const* a = va;
    const nodeclass* const* b = vb;
    fourcc_t AClass = NodeClass_ClassId(*a);
    fourcc_t BClass = NodeClass_ClassId(*b);
    if (AClass > BClass) return 1;
    if (AClass < BClass) return -1;
    if ((*a)->Module != (*b)->Module)
        return ((*a)->Module > (*b)->Module) ? 1:-1;
    return 0;
}